

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O2

void MIR_set_gen_interface(MIR_context_t ctx,MIR_item_t func_item)

{
  gen_ctx *pgVar1;
  VARR_call_ref_t *pVVar2;
  MIR_func_t pMVar3;
  long lVar4;
  uint8_t *puVar5;
  char *pcVar6;
  size_t sVar7;
  char *__format;
  uint8_t *puVar8;
  uint8_t *puVar9;
  uint8_t **ppuVar10;
  bool bVar11;
  int local_44;
  MIR_context_t local_40;
  uint8_t *addr;
  
  if (func_item != (MIR_item_t)0x0) {
    MIR_gen(ctx,func_item);
    return;
  }
  pgVar1 = ctx->gen_ctx;
  pVVar2 = pgVar1->target_ctx->call_refs;
  if (pVVar2 == (VARR_call_ref_t *)0x0) {
    pcVar6 = "length";
LAB_0012d8c9:
    mir_varr_assert_fail(pcVar6,"call_ref_t");
  }
  sVar7 = pVVar2->els_num;
  if (sVar7 != 0) {
    ppuVar10 = &pVVar2->varr->call_addr;
    local_40 = ctx;
    while (bVar11 = sVar7 != 0, sVar7 = sVar7 - 1, bVar11) {
      pMVar3 = (((call_ref_t *)(ppuVar10 + -1))->ref_func_item->u).func;
      puVar9 = (uint8_t *)pMVar3->machine_code;
      puVar5 = *ppuVar10;
      local_44 = *(int *)(puVar5 + 2);
      addr = puVar9;
      if (*puVar5 == '@') {
        puVar8 = puVar5 + (long)local_44 + 6;
        if ((puVar8 != puVar9) &&
           (0xfffffffeffffffff < ((long)puVar9 - (long)(puVar5 + 6)) - 0x80000000U)) {
          local_44 = (int)((long)puVar9 - (long)(puVar5 + 6));
          _MIR_change_code(local_40,puVar5 + 2,(uint8_t *)&local_44,4);
          pcVar6 = "32";
          puVar9 = puVar8;
          goto LAB_0012d7fe;
        }
        if ((pgVar1->debug_file == (FILE *)0x0) || (pgVar1->debug_level < 2)) goto LAB_0012d843;
        pcVar6 = pMVar3->name;
        __format = 
        "Failing to make direct 32-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n"
        ;
LAB_0012d866:
        fprintf(_stderr,__format,pcVar6,puVar5,puVar8,puVar9);
      }
      else {
        if (*puVar5 != 0xff) {
          __assert_fail("call_addr[0] == 0x40",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen-x86_64.c"
                        ,0xbb6,"void target_change_to_direct_calls(MIR_context_t)");
        }
        puVar8 = *(uint8_t **)(puVar5 + (long)local_44 + 6);
        if (puVar9 != puVar8) {
          lVar4 = (long)local_44;
          _MIR_change_code(local_40,puVar5 + lVar4 + 6,(uint8_t *)&addr,8);
          pcVar6 = "64";
          puVar5 = puVar5 + lVar4 + 6;
          puVar9 = puVar8;
LAB_0012d7fe:
          puVar8 = puVar5;
          if ((pgVar1->debug_file != (FILE *)0x0) && (1 < pgVar1->debug_level)) {
            puVar5 = (uint8_t *)pMVar3->name;
            __format = 
            "Making direct %s-bit call of func %s at 0x%llx (addr: before=0x%llx, after=0x%llx)\n";
            goto LAB_0012d866;
          }
        }
      }
LAB_0012d843:
      ppuVar10 = ppuVar10 + 2;
    }
    pVVar2 = pgVar1->target_ctx->call_refs;
    if ((pVVar2 == (VARR_call_ref_t *)0x0) || (pVVar2->varr == (call_ref_t *)0x0)) {
      pcVar6 = "trunc";
      goto LAB_0012d8c9;
    }
    pVVar2->els_num = 0;
  }
  return;
}

Assistant:

void MIR_set_gen_interface (MIR_context_t ctx, MIR_item_t func_item) {
  if (func_item == NULL) { /* finish setting interfaces */
    target_change_to_direct_calls (ctx);
  } else {
    MIR_gen (ctx, func_item);
  }
}